

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_strchr_63(UChar *s,UChar c)

{
  UChar local_1a;
  UChar cs;
  UChar *pUStack_18;
  UChar c_local;
  UChar *s_local;
  
  pUStack_18 = s;
  if ((c & 0xf800U) == 0xd800) {
    local_1a = c;
    s_local = u_strFindFirst_63(s,-1,&local_1a,1);
  }
  else {
    for (; *pUStack_18 != c; pUStack_18 = pUStack_18 + 1) {
      if (*pUStack_18 == L'\0') {
        return (UChar *)0x0;
      }
    }
    s_local = pUStack_18;
  }
  return s_local;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_strchr(const UChar *s, UChar c) {
    if(U16_IS_SURROGATE(c)) {
        /* make sure to not find half of a surrogate pair */
        return u_strFindFirst(s, -1, &c, 1);
    } else {
        UChar cs;

        /* trivial search for a BMP code point */
        for(;;) {
            if((cs=*s)==c) {
                return (UChar *)s;
            }
            if(cs==0) {
                return NULL;
            }
            ++s;
        }
    }
}